

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

bool P_Thing_Projectile(int tid,AActor *source,int type,char *type_name,DAngle *angle,double speed,
                       double vspeed,int dest,AActor *forcedest,int gravity,int newtid,
                       bool leadTarget)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  PClassActor *this;
  AActor *pAVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  DVector3 aim;
  TVector3<double> local_128;
  AActor *local_108;
  double local_100;
  DAngle *local_f8;
  double local_f0;
  double local_e8;
  PClassActor *local_e0;
  FActorIterator tit;
  FActorIterator iterator;
  DVector3 aimvec;
  TVector3<double> local_98;
  DMatrix3x3 rm;
  
  iterator.base = (AActor *)0x0;
  local_f8 = angle;
  local_f0 = vspeed;
  iterator.id = tid;
  if (type_name == (char *)0x0) {
    this = P_GetSpawnableType(type);
  }
  else {
    this = PClass::FindActor(type_name);
  }
  if (this != (PClassActor *)0x0) {
    local_e0 = PClassActor::GetReplacement(this,true);
    uVar1 = *(uint *)((local_e0->super_PClass).Defaults + 0x1c4);
    if (((uVar1 >> 0xd & 1) == 0) ||
       (((dmflags.Value._1_1_ & 0x10) == 0 && ((level.flags2._1_1_ & 0x80) == 0)))) {
      if (tid != 0) {
        source = FActorIterator::Next(&iterator);
      }
      local_e8 = *(double *)(&DAT_005d8db0 + (ulong)((uVar1 & 1) == 0) * 8);
      bVar4 = false;
      do {
        if (source == (AActor *)0x0) {
          return bVar4;
        }
        tit.base = (AActor *)0x0;
        pAVar7 = forcedest;
        tit.id = dest;
        if (dest == 0) goto LAB_00458049;
        forcedest = FActorIterator::Next(&tit);
        pAVar7 = forcedest;
        while (forcedest != (AActor *)0x0) {
LAB_00458049:
          local_108 = pAVar7;
          rm.Cells[0][2] = local_e8;
          if ((uVar1 & 3) == 0) {
            dVar11 = (source->__Pos).Z;
            rm.Cells[0][2] = -2147483648.0;
            if ((dVar11 != -2147483648.0) || (NAN(dVar11))) {
              rm.Cells[0][2] = dVar11 - source->Floorclip;
            }
          }
          rm.Cells[0][0] = (source->__Pos).X;
          rm.Cells[0][1] = (source->__Pos).Y;
          pAVar7 = Spawn(local_e0,(DVector3 *)&rm,ALLOW_REPLACE);
          bVar2 = bVar4;
          if (pAVar7 != (AActor *)0x0) {
            pAVar7->tid = newtid;
            AActor::AddToHash(pAVar7);
            P_PlaySpawnSound(pAVar7,source);
            uVar6 = (pAVar7->flags).Value;
            if (gravity == 0) {
              (pAVar7->flags).Value = uVar6 | 0x200;
            }
            else {
              (pAVar7->flags).Value = uVar6 & 0xfffffdff;
              if ((gravity == 1) && (((pAVar7->flags3).Value & 0x2000) == 0)) {
                pAVar7->Gravity = 0.125;
              }
            }
            (pAVar7->target).field_0.p = source;
            if (forcedest == (AActor *)0x0) {
              (pAVar7->Angles).Yaw.Degrees = local_f8->Degrees;
              AActor::VelFromAngle(pAVar7,speed);
              (pAVar7->Vel).Z = local_f0;
            }
            else {
              AActor::Vec3To(&aim,pAVar7,forcedest);
              aim.Z = forcedest->Height * 0.5 + aim.Z;
              if ((speed <= 0.0 || !leadTarget) ||
                 (bVar3 = TVector3<double>::isZero(&forcedest->Vel), bVar3)) {
LAB_00458184:
                AActor::AngleTo((AActor *)&rm,pAVar7,SUB81(forcedest,0));
                (pAVar7->Angles).Yaw.Degrees = rm.Cells[0][0];
                TVector3<double>::Resized((TVector3<double> *)&rm,&aim,speed);
                (pAVar7->Vel).Z = rm.Cells[0][2];
                (pAVar7->Vel).X = rm.Cells[0][0];
                (pAVar7->Vel).Y = rm.Cells[0][1];
              }
              else {
                local_128.X = (forcedest->Vel).X;
                local_128.Y = (forcedest->Vel).Y;
                local_128.Z = (forcedest->Vel).Z;
                if ((((forcedest->flags).Value & 0x200) == 0) && (forcedest->waterlevel < 3)) {
                  local_128.Z = 0.0;
                  if ((((local_128.X == 0.0) && (!NAN(local_128.X))) && (local_128.Y == 0.0)) &&
                     (!NAN(local_128.Y))) goto LAB_00458184;
                }
                dVar8 = TVector3<double>::Length(&aim);
                dVar9 = TVector3<double>::Length(&local_128);
                dVar10 = (((-aim.Y * local_128.Y - aim.X * local_128.X) - aim.Z * local_128.Z) /
                         dVar9) / dVar8;
                dVar11 = 1.0;
                if (dVar10 <= 1.0) {
                  dVar11 = dVar10;
                }
                local_100 = c_acos((double)(~-(ulong)(-1.0 < dVar10) & 0xbff0000000000000 |
                                           (ulong)dVar11 & -(ulong)(-1.0 < dVar10)));
                iVar5 = FRandom::Random2(&pr_leadtarget);
                dVar11 = fastsin(local_100);
                dVar11 = ((((double)iVar5 * 0.1) / 255.0 + 1.1) * dVar9 * dVar11) / speed;
                dVar9 = (double)(~-(ulong)(-1.0 < dVar11) & 0x3ff0000000000000 |
                                (-(ulong)(1.0 <= dVar11) & 0xbff0000000000000 |
                                ~-(ulong)(1.0 <= dVar11) & (ulong)-dVar11) & -(ulong)(-1.0 < dVar11)
                                );
                local_98.X = aim.Z * local_128.Y - local_128.Z * aim.Y;
                local_98.Y = aim.X * local_128.Z - local_128.X * aim.Z;
                local_98.Z = aim.Y * local_128.X - local_128.Y * aim.X;
                TVector3<double>::MakeUnit(&local_98);
                dVar11 = c_asin(dVar9);
                dVar11 = fastcos(dVar11);
                TMatrix3x3<double>::TMatrix3x3(&rm,&local_98,dVar11,dVar9);
                operator*(&aimvec,&rm,&aim);
                dVar8 = speed / dVar8;
                (pAVar7->Vel).Z = aimvec.Z * dVar8;
                (pAVar7->Vel).X = dVar8 * aimvec.X;
                (pAVar7->Vel).Y = dVar8 * aimvec.Y;
                AActor::AngleFromVel(pAVar7);
              }
              if (((pAVar7->flags2).Value & 0x40000000) != 0) {
                (pAVar7->tracer).field_0.p = forcedest;
              }
            }
            if (((pAVar7->flags).Value & 0x10000) != 0) {
              dVar11 = TVector3<double>::Length(&pAVar7->Vel);
              pAVar7->Speed = dVar11;
            }
            if (((pAVar7->flags3).Value & 3) != 0) {
              (pAVar7->Vel).Z = 0.0;
            }
            uVar6 = (pAVar7->flags).Value;
            if ((uVar6 & 1) != 0) {
              uVar6 = uVar6 | 0x20000;
              (pAVar7->flags).Value = uVar6;
            }
            if ((uVar6 >> 0x10 & 1) == 0) {
              bVar3 = P_TestMobjLocation(pAVar7);
              bVar2 = true;
              if (!bVar3) {
                AActor::ClearCounters(pAVar7);
                (*(pAVar7->super_DThinker).super_DObject._vptr_DObject[4])(pAVar7);
                bVar2 = bVar4;
              }
            }
            else {
              bVar4 = P_CheckMissileSpawn(pAVar7,source->radius);
              if (bVar4) {
                bVar2 = true;
              }
            }
          }
          forcedest = local_108;
          bVar4 = bVar2;
          if (dest == 0) goto LAB_00458565;
          forcedest = FActorIterator::Next(&tit);
          pAVar7 = local_108;
        }
        forcedest = (AActor *)0x0;
LAB_00458565:
        source = FActorIterator::Next(&iterator);
      } while( true );
    }
  }
  return false;
}

Assistant:

bool P_Thing_Projectile (int tid, AActor *source, int type, const char *type_name, DAngle angle,
	double speed, double vspeed, int dest, AActor *forcedest, int gravity, int newtid,
	bool leadTarget)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj, *targ = forcedest;
	FActorIterator iterator (tid);
	int defflags3;

	if (type_name == NULL)
	{
		kind = P_GetSpawnableType(type);
	}
	else
	{
		kind = PClass::FindActor(type_name);
	}
	if (kind == NULL)
	{
		return false;
	}

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	defflags3 = GetDefaultByType(kind)->flags3;
	if ((defflags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		FActorIterator tit (dest);

		if (dest == 0 || (targ = tit.Next()))
		{
			do
			{
				double z = spot->Z();
				if (defflags3 & MF3_FLOORHUGGER)
				{
					z = ONFLOORZ;
				}
				else if (defflags3 & MF3_CEILINGHUGGER)
				{
					z = ONCEILINGZ;
				}
				else if (z != ONFLOORZ)
				{
					z -= spot->Floorclip;
				}
				mobj = Spawn (kind, spot->PosAtZ(z), ALLOW_REPLACE);

				if (mobj)
				{
					mobj->tid = newtid;
					mobj->AddToHash ();
					P_PlaySpawnSound(mobj, spot);
					if (gravity)
					{
						mobj->flags &= ~MF_NOGRAVITY;
						if (!(mobj->flags3 & MF3_ISMONSTER) && gravity == 1)
						{
							mobj->Gravity = 1./8;
						}
					}
					else
					{
						mobj->flags |= MF_NOGRAVITY;
					}
					mobj->target = spot;

					if (targ != NULL)
					{
						DVector3 aim = mobj->Vec3To(targ);
						aim.Z += targ->Height / 2;

						if (leadTarget && speed > 0 && !targ->Vel.isZero())
						{
							// Aiming at the target's position some time in the future
							// is basically just an application of the law of sines:
							//     a/sin(A) = b/sin(B)
							// Thanks to all those on the notgod phorum for helping me
							// with the math. I don't think I would have thought of using
							// trig alone had I been left to solve it by myself.

							DVector3 tvel = targ->Vel;
							if (!(targ->flags & MF_NOGRAVITY) && targ->waterlevel < 3)
							{ // If the target is subject to gravity and not underwater,
							  // assume that it isn't moving vertically. Thanks to gravity,
							  // even if we did consider the vertical component of the target's
							  // velocity, we would still miss more often than not.
								tvel.Z = 0.0;
								if (targ->Vel.X == 0 && targ->Vel.Y == 0)
								{
									goto nolead;
								}
							}
							double dist = aim.Length();
							double targspeed = tvel.Length();
							double ydotx = -aim | tvel;
							double a = g_acos (clamp (ydotx / targspeed / dist, -1.0, 1.0));
							double multiplier = double(pr_leadtarget.Random2())*0.1/255+1.1;
							double sinb = -clamp (targspeed*multiplier * g_sin(a) / speed, -1.0, 1.0);

							// Use the cross product of two of the triangle's sides to get a
							// rotation vector.
							DVector3 rv(tvel ^ aim);
							// The vector must be normalized.
							rv.MakeUnit();
							// Now combine the rotation vector with angle b to get a rotation matrix.
							DMatrix3x3 rm(rv, g_cos(g_asin(sinb)), sinb);
							// And multiply the original aim vector with the matrix to get a
							// new aim vector that leads the target.
							DVector3 aimvec = rm * aim;
							// And make the projectile follow that vector at the desired speed.
							mobj->Vel = aimvec * (speed / dist);
							mobj->AngleFromVel();
						}
						else
						{
nolead:
							mobj->Angles.Yaw = mobj->AngleTo(targ);
							mobj->Vel = aim.Resized (speed);
						}
						if (mobj->flags2 & MF2_SEEKERMISSILE)
						{
							mobj->tracer = targ;
						}
					}
					else
					{
						mobj->Angles.Yaw = angle;
						mobj->VelFromAngle(speed);
						mobj->Vel.Z = vspeed;
					}
					// Set the missile's speed to reflect the speed it was spawned at.
					if (mobj->flags & MF_MISSILE)
					{
						mobj->Speed = mobj->VelToSpeed();
					}
					// Hugger missiles don't have any vertical velocity
					if (mobj->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
					{
						mobj->Vel.Z = 0;
					}
					if (mobj->flags & MF_SPECIAL)
					{
						mobj->flags |= MF_DROPPED;
					}
					if (mobj->flags & MF_MISSILE)
					{
						if (P_CheckMissileSpawn (mobj, spot->radius))
						{
							rtn = true;
						}
					}
					else if (!P_TestMobjLocation (mobj))
					{
						// If this is a monster, subtract it from the total monster
						// count, because it already added to it during spawning.
						mobj->ClearCounters();
						mobj->Destroy ();
					}
					else
					{
						// It spawned fine.
						rtn = 1;
					}
				}
			} while (dest != 0 && (targ = tit.Next()));
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}